

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

int redisvAsyncCommand(redisAsyncContext *ac,redisCallbackFn *fn,void *privdata,char *format,
                      __va_list_tag *ap)

{
  int iVar1;
  int status;
  int len;
  char *cmd;
  __va_list_tag *ap_local;
  char *format_local;
  void *privdata_local;
  redisCallbackFn *fn_local;
  redisAsyncContext *ac_local;
  
  cmd = (char *)ap;
  ap_local = (__va_list_tag *)format;
  format_local = (char *)privdata;
  privdata_local = fn;
  fn_local = (redisCallbackFn *)ac;
  pthread_mutex_lock((pthread_mutex_t *)&ac->ctxlock);
  iVar1 = redisvFormatCommand((char **)&status,(char *)ap_local,(__va_list_tag *)cmd);
  if (iVar1 < 0) {
    pthread_mutex_lock((pthread_mutex_t *)(fn_local + 0xf0));
    ac_local._4_4_ = -1;
  }
  else {
    iVar1 = __redisAsyncCommand((redisAsyncContext *)fn_local,(redisCallbackFn *)privdata_local,
                                format_local,_status,(long)iVar1);
    free(_status);
    pthread_mutex_unlock((pthread_mutex_t *)(fn_local + 0xf0));
    ac_local._4_4_ = iVar1;
  }
  return ac_local._4_4_;
}

Assistant:

int redisvAsyncCommand(redisAsyncContext *ac, redisCallbackFn *fn, void *privdata, const char *format, va_list ap) {
    pthread_mutex_lock(&ac->ctxlock);
    char *cmd;
    int len;
    int status;
    len = redisvFormatCommand(&cmd,format,ap);

    /* We don't want to pass -1 or -2 to future functions as a length. */
    if (len < 0) {
        pthread_mutex_lock(&ac->ctxlock);
        return REDIS_ERR;
    }

    status = __redisAsyncCommand(ac,fn,privdata,cmd,len);
    free(cmd);
    pthread_mutex_unlock(&ac->ctxlock);
    return status;
}